

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemRecordMap.cpp
# Opt level: O1

MemRecordMap * MemRecordMap::getInstance(void)

{
  int iVar1;
  undefined8 uVar2;
  _Rb_tree_header *p_Var3;
  
  if (pInstance == (MemRecordMap *)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&m_memMutex);
    if (iVar1 != 0) {
      uVar2 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)&m_memMutex);
      _Unwind_Resume(uVar2);
    }
    if (pInstance == (MemRecordMap *)0x0) {
      pInstance = (MemRecordMap *)operator_new(0x30);
      p_Var3 = &(pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(pInstance->m_memRecordMap)._M_t._M_impl = 0;
      *(undefined8 *)&(pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var3->_M_header;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var3->_M_header;
      (pInstance->m_memRecordMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&m_memMutex);
  }
  return pInstance;
}

Assistant:

MemRecordMap* MemRecordMap::getInstance() {//DCL(double check lock)
    if(pInstance == nullptr){//first check
        lock_guard<mutex> guard(m_memMutex);//RAII
        if(pInstance == nullptr)//second check
            pInstance = new MemRecordMap();//c++11 will ensure this new operator atomic
    }
    return pInstance;
}